

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file_handle.cpp
# Opt level: O3

void __thiscall
SplitFixture_Empty_Test<const_unsigned_char>::~SplitFixture_Empty_Test
          (SplitFixture_Empty_Test<const_unsigned_char> *this)

{
  (this->super_SplitFixture<const_unsigned_char>).super_Test._vptr_Test =
       (_func_int **)&PTR__SplitFixture_001e5e68;
  testing::internal::FunctionMocker<unsigned_long_(const_void_*,_unsigned_long)>::~FunctionMocker
            (&(this->super_SplitFixture<const_unsigned_char>).callback.gmock12_call_31);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TYPED_TEST (SplitFixture, Empty) {
    TypeParam buffer{};
    constexpr std::size_t size{0};
    EXPECT_CALL (this->callback, call (&buffer, size)).Times (0);

    using pstore::file::details::split;
    std::size_t const total = split<std::uint16_t> (&buffer, size, this->callback);
    EXPECT_EQ (size, total);
}